

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::Monomorphize::run(Monomorphize *this,Module *module)

{
  __node_base_ptr *this_00;
  pointer puVar1;
  __node_base_ptr p_Var2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  long *plVar5;
  undefined1 auVar6 [16];
  void *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Expression ***pppEVar9;
  undefined4 uVar10;
  mapped_type mVar11;
  pointer ppEVar12;
  char cVar13;
  char cVar14;
  Index IVar15;
  int *piVar16;
  ulong uVar17;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *psVar18;
  Function *pFVar19;
  Module *this_01;
  mapped_type *pmVar20;
  Module *out;
  size_type sVar21;
  bool *pbVar22;
  __hash_code __c;
  __node_ptr p_Var23;
  Type *pTVar24;
  size_t sVar25;
  Type TVar26;
  Index *pIVar27;
  mapped_type *pmVar28;
  mapped_type *pmVar29;
  mapped_type *pmVar30;
  Expression *pEVar31;
  LocalSet *pLVar32;
  Builder BVar33;
  mapped_type *pmVar34;
  undefined8 uVar35;
  uint uVar36;
  pointer pNVar37;
  char *pcVar38;
  ulong uVar39;
  ulong extraout_RDX;
  pointer pCVar40;
  pointer pTVar41;
  size_t *psVar42;
  pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *__k;
  undefined8 *puVar43;
  Type in_R8;
  Module *pMVar44;
  Module *in_R9;
  int iVar45;
  _func_int *p_Var46;
  pointer *ppCVar47;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar48;
  long lVar49;
  char *pcVar50;
  undefined1 auVar51 [8];
  uint uVar52;
  size_t *this_02;
  undefined1 auVar53 [8];
  _Head_base<0UL,_wasm::Function_*,_false> _Var54;
  bool bVar55;
  double dVar56;
  Signature SVar57;
  Name NVar58;
  Name newTarget;
  optional<wasm::Type> type;
  Name newTarget_00;
  undefined1 local_6d0 [8];
  ReturnCallersMap returnCallersMap;
  CallFinder callFinder;
  ShallowEffectAnalyzer currEffects;
  size_type __dnew;
  long local_438;
  char local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> vStack_370;
  size_t *local_358;
  bool *local_350;
  size_t *local_348;
  _func_int *local_340;
  _func_int **local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  size_t *local_328;
  bool *local_320;
  size_t *local_318;
  pointer local_310;
  pointer local_308;
  Expression ***local_300;
  size_t *psStack_2f8;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  immovable;
  undefined1 local_2b8 [16];
  Expression **local_2a8;
  char local_2a0;
  pointer local_290;
  pointer local_288;
  pointer local_280;
  undefined1 auStack_278 [8];
  EffectAnalyzer nonMovingEffects;
  Expression *pEStack_108;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> newOperands;
  pointer pNStack_e8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 auStack_c8 [8];
  Name target;
  Builder builder;
  key_type local_94;
  id local_90;
  Expression *child;
  Monomorphize *local_80;
  undefined1 auStack_78 [8];
  CallContext context;
  Expression *curr;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> monoFunc;
  
  callFinder.infos.
  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&currEffects.super_EffectAnalyzer.module;
  currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0x18;
  local_80 = this;
  callFinder.infos.
  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::__cxx11::string::_M_create
                          ((ulong *)&callFinder.infos.
                                     super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (ulong)&currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count);
  currEffects.super_EffectAnalyzer.module =
       (Module *)
       currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
       _M_node_count;
  (callFinder.infos.
   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
   ._M_impl.super__Vector_impl_data._M_end_of_storage)->call = (Call *)0x70726f6d6f6e6f6d;
  (callFinder.infos.
   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
   ._M_impl.super__Vector_impl_data._M_end_of_storage)->drop = (Expression **)0x6e696d2d657a6968;
  callFinder.infos.
  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].call = (Call *)0x746966656e65622d;
  currEffects.super_EffectAnalyzer.ignoreImplicitTraps =
       (bool)(undefined1)
             currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
             _M_node_count;
  currEffects.super_EffectAnalyzer.trapsNeverHappen =
       (bool)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
             _M_node_count._1_1_;
  currEffects.super_EffectAnalyzer._2_6_ =
       currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
       _M_node_count._2_6_;
  *(undefined1 *)
   ((long)&(callFinder.infos.
            super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)->call +
   currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
   ) = 0;
  uVar52 = wasm::(anonymous_namespace)::MinPercentBenefit;
  cVar14 = '\x01';
  if (9 < wasm::(anonymous_namespace)::MinPercentBenefit) {
    uVar36 = wasm::(anonymous_namespace)::MinPercentBenefit;
    cVar13 = '\x04';
    do {
      cVar14 = cVar13;
      if (uVar36 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0098e2ee;
      }
      if (uVar36 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0098e2ee;
      }
      if (uVar36 < 10000) goto LAB_0098e2ee;
      bVar55 = 99999 < uVar36;
      uVar36 = uVar36 / 10000;
      cVar13 = cVar14 + '\x04';
    } while (bVar55);
    cVar14 = cVar14 + '\x01';
  }
LAB_0098e2ee:
  currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
       = (size_t)&local_438;
  std::__cxx11::string::_M_construct
            ((ulong)&currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count,(uint)__dnew,uVar52);
  Pass::getArgumentOrDefault
            ((string *)auStack_278,&local_80->super_Pass,
             (string *)
             &callFinder.infos.
              super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)
             &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
              _M_node_count);
  auVar51 = auStack_278;
  piVar16 = __errno_location();
  iVar45 = *piVar16;
  *piVar16 = 0;
  uVar17 = strtoul((char *)auVar51,(char **)&returnCallersMap._M_h._M_single_bucket,10);
  if ((undefined1  [8])returnCallersMap._M_h._M_single_bucket == auVar51) {
    uVar35 = std::__throw_invalid_argument("stoul");
    if ((long *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                _M_node_count != &local_438) {
      operator_delete((void *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,local_438 + 1);
    }
    if (callFinder.infos.
        super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)&currEffects.super_EffectAnalyzer.module) {
      operator_delete(callFinder.infos.
                      super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)((long)&((currEffects.super_EffectAnalyzer.module)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Unwind_Resume(uVar35);
  }
  if (*piVar16 == 0) {
    *piVar16 = iVar45;
  }
  else if (*piVar16 == 0x22) {
    std::__throw_out_of_range("stoul");
  }
  wasm::(anonymous_namespace)::MinPercentBenefit = (uint)uVar17;
  if (auStack_278 != (undefined1  [8])&nonMovingEffects.module) {
    operator_delete((void *)auStack_278,
                    (ulong)((long)&((nonMovingEffects.module)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((long *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
              _M_node_count != &local_438) {
    operator_delete((void *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,local_438 + 1);
  }
  if (callFinder.infos.
      super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)&currEffects.super_EffectAnalyzer.module) {
    operator_delete(callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (ulong)((long)&((currEffects.super_EffectAnalyzer.module)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  ReturnUtils::findReturnCallers
            ((unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
              *)local_6d0,module);
  pNStack_e8 = (pointer)0x0;
  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar48 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar48 != puVar1) {
    do {
      pFVar19 = (puVar48->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((pFVar19->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        if (funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_e8,
                     (iterator)
                     funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,(Name *)pFVar19);
        }
        else {
          pcVar38 = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               *(size_t *)&(pFVar19->super_Importable).super_Named;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar38;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      puVar48 = puVar48 + 1;
    } while (puVar48 != puVar1);
  }
  local_308 = funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (pNStack_e8 !=
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_300 = &callFinder.
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .stack.fixed._M_elems[9].currp;
    local_330 = &local_398;
    psVar18 = &nonMovingEffects.globalsWritten;
    local_358 = &currEffects.super_EffectAnalyzer.breakTargets._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count;
    local_350 = &currEffects.super_EffectAnalyzer.danglingPop;
    local_348 = &currEffects.super_EffectAnalyzer.mutableGlobalsRead._M_t._M_impl.
                 super__Rb_tree_header._M_node_count;
    local_328 = &nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_320 = &nonMovingEffects.danglingPop;
    local_318 = &nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count;
    newOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_80->funcContextMap;
    pNVar37 = pNStack_e8;
    do {
      local_340 = (_func_int *)(pNVar37->super_IString).str._M_str;
      local_310 = pNVar37;
      pFVar19 = Module::getFunction(module,(Name)(pNVar37->super_IString).str);
      pppEVar9 = local_300;
      this_00 = &returnCallersMap._M_h._M_single_bucket;
      returnCallersMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      callFinder.
      super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
      .replacep = (Expression **)0x0;
      local_300[6] = (Expression **)0x0;
      pppEVar9[7] = (Expression **)0x0;
      pppEVar9[4] = (Expression **)0x0;
      pppEVar9[5] = (Expression **)0x0;
      pppEVar9[2] = (Expression **)0x0;
      pppEVar9[3] = (Expression **)0x0;
      *pppEVar9 = (Expression **)0x0;
      pppEVar9[1] = (Expression **)0x0;
      if ((long)callFinder.
                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .stack.flexible.
                super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4 != 0) {
        pcVar38 = 
        "void wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::CallFinder, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::CallFinder>]"
        ;
LAB_0098f9e1:
        __assert_fail("stack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x12d,pcVar38);
      }
      Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                  *)this_00,
                 PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 ::scan,&pFVar19->body);
      while (((long)callFinder.
                    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)callFinder.
                    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)callFinder.
                   super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .replacep != 0) {
        if ((pointer)callFinder.
                     super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .stack.fixed._M_elems[9].currp ==
            callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (callFinder.
              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
              .replacep == (Expression **)0x0) {
            pcVar38 = 
            "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, N = 10]"
            ;
LAB_0098f9a3:
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,pcVar38);
          }
          pTVar41 = (pointer)(&(&callFinder)[-1].infos.
                               super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                             (long)callFinder.
                                   super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                   .replacep * 2);
        }
        else {
          pTVar41 = callFinder.
                    super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        p_Var2 = (__node_base_ptr)pTVar41->currp;
        if ((pointer)callFinder.
                     super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .stack.fixed._M_elems[9].currp ==
            callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (callFinder.
              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
              .replacep == (Expression **)0x0) {
            pcVar38 = 
            "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, N = 10]"
            ;
LAB_0098f984:
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x75,pcVar38);
          }
          callFinder.
          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .replacep = (Expression **)
                      ((long)callFinder.
                             super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                             .replacep + -1);
        }
        else {
          callFinder.
          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               callFinder.
               super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        returnCallersMap._M_h._M_single_bucket = p_Var2;
        if ((Expression *)p_Var2->_M_nxt == (Expression *)0x0) {
          pcVar38 = 
          "void wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::CallFinder, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::CallFinder>]"
          ;
LAB_0098f946:
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,pcVar38);
        }
        (*(code *)pTVar41->func)((CallFinder *)this_00,(Expression **)p_Var2);
      }
      nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)callFinder.infos.
                   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      this_01 = callFinder.
                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .currModule;
      pCVar40 = callFinder.infos.
                super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (callFinder.
          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .currModule !=
          (Module *)
          callFinder.infos.
          super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          this_02 = &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count;
          pp_Var3 = ((Pass *)&this_01->exports)->_vptr_Pass;
          if ((pp_Var3[1] != (_func_int *)0x1) && (pp_Var3[7] != local_340)) {
            pFVar19 = Module::getFunction(module,(Name)((IString *)
                                                       (((Pass *)&this_01->exports)->_vptr_Pass + 6)
                                                       )->str);
            auStack_278 = (undefined1  [8])pFVar19;
            pmVar20 = std::__detail::
                      _Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_6d0,(key_type *)auStack_278);
            if (*pmVar20 == true) {
              ((Pass *)&this_01->exports)->runner = (PassRunner *)0x0;
            }
            pp_Var3 = ((Pass *)&this_01->exports)->_vptr_Pass;
            auStack_c8 = (undefined1  [8])pp_Var3[6];
            target.super_IString.str._M_len = (size_t)pp_Var3[7];
            out = (Module *)Module::getFunction(module,(IString)*(IString *)(pp_Var3 + 6));
            pbVar8 = local_330;
            pCVar40 = (pointer)nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count;
            if ((out->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
              auStack_78 = (undefined1  [8])0x0;
              context.operands.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              context.operands.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              newOperands.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              pEStack_108 = (Expression *)0x0;
              newOperands.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              child = (Expression *)(local_80->super_Pass).runner;
              currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
              _M_node_count = 0;
              __dnew = 0;
              local_338 = pp_Var3;
              target.super_IString.str._M_str = (char *)module;
              local_330[1].field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pbVar8[1].field_2 + 8) = 0;
              pbVar8[1]._M_dataplus._M_p = (pointer)0x0;
              pbVar8[1]._M_string_length = 0;
              (pbVar8->field_2)._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pbVar8->field_2 + 8) = 0;
              (pbVar8->_M_dataplus)._M_p = (pointer)0x0;
              pbVar8->_M_string_length = 0;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
                        (&vStack_370,
                         (long)context.operands.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3);
              pp_Var3 = ((Pass *)&this_01->exports)->_vptr_Pass;
              p_Var4 = pp_Var3[3];
              if (p_Var4 != (_func_int *)0x0) {
                p_Var46 = (_func_int *)0x0;
                do {
                  if (pp_Var3[3] <= p_Var46) goto LAB_0098f9ad;
                  auStack_278 = (undefined1  [8])*(size_t *)(pp_Var3[2] + (long)p_Var46 * 8);
                  if (((long)(local_398._M_string_length - (long)local_398._M_dataplus._M_p) >> 4) +
                      __dnew != 0) {
                    pcVar38 = 
                    "void wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::walk(Expression *&) [SubType = Lister, VisitorType = wasm::UnifiedExpressionVisitor<Lister>]"
                    ;
                    goto LAB_0098f9e1;
                  }
                  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::pushTask
                            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)
                             this_02,PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                                     ::scan,(Expression **)auStack_278);
                  while (((long)(local_398._M_string_length - (long)local_398._M_dataplus._M_p) >> 4
                         ) + __dnew != 0) {
                    if (local_398._M_dataplus._M_p == (pointer)local_398._M_string_length) {
                      if (__dnew == 0) {
                        pcVar38 = 
                        "T &wasm::SmallVector<wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, 10>::back() [T = wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, N = 10]"
                        ;
                        goto LAB_0098f9a3;
                      }
                      psVar42 = &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                 super__Rb_tree_header._M_node_count + __dnew * 2;
                    }
                    else {
                      psVar42 = (size_t *)(local_398._M_string_length + -0x10);
                    }
                    plVar5 = (long *)psVar42[1];
                    if (local_398._M_dataplus._M_p == (pointer)local_398._M_string_length) {
                      if (__dnew == 0) {
                        pcVar38 = 
                        "void wasm::SmallVector<wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, 10>::pop_back() [T = wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, N = 10]"
                        ;
                        goto LAB_0098f984;
                      }
                      __dnew = __dnew - 1;
                    }
                    else {
                      local_398._M_string_length = local_398._M_string_length + -0x10;
                    }
                    currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                    super__Rb_tree_header._M_node_count = (size_t)plVar5;
                    if (*plVar5 == 0) {
                      pcVar38 = 
                      "void wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::walk(Expression *&) [SubType = Lister, VisitorType = wasm::UnifiedExpressionVisitor<Lister>]"
                      ;
                      goto LAB_0098f946;
                    }
                    (*(code *)*psVar42)(this_02);
                  }
                  p_Var46 = p_Var46 + 1;
                } while (p_Var46 != p_Var4);
              }
              psStack_2f8 = &immovable._M_h._M_rehash_policy._M_next_resize;
              immovable._M_h._M_buckets = (__buckets_ptr)0x1;
              immovable._M_h._M_bucket_count = 0;
              immovable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              immovable._M_h._M_element_count._0_4_ = 0x3f800000;
              immovable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
              immovable._M_h._M_rehash_policy._4_4_ = 0;
              immovable._M_h._M_rehash_policy._M_next_resize = 0;
              auStack_278._0_2_ = *(undefined2 *)(child + 5);
              nonMovingEffects._0_8_ = module;
              nonMovingEffects.module._0_6_ = CONCAT24(0,(module->features).features);
              nonMovingEffects.localsRead._M_t._M_impl._0_4_ = 0;
              nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&nonMovingEffects.localsRead;
              nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)0x0;
              nonMovingEffects.localsWritten._M_t._M_impl._0_4_ = 0;
              nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                   = (_Base_ptr)&nonMovingEffects.localsWritten;
              nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)0x0;
              nonMovingEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
              nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_color = _S_red;
              nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
                   = 0;
              nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent = (_Base_ptr)&nonMovingEffects.mutableGlobalsRead;
              nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_right = (_Base_ptr)0x0;
              nonMovingEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
              nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                   = _S_red;
              nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
              ;
              nonMovingEffects.breakTargets._M_t._M_impl._0_4_ = 0;
              nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              nonMovingEffects.readsMemory = false;
              nonMovingEffects.writesMemory = false;
              nonMovingEffects.readsTable = false;
              nonMovingEffects.writesTable = false;
              nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                   = (_Base_ptr)0x0;
              nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              nonMovingEffects.trap = false;
              nonMovingEffects.implicitTrap = false;
              nonMovingEffects.isAtomic = false;
              nonMovingEffects.throws_ = false;
              nonMovingEffects._228_4_ = 0;
              nonMovingEffects.tryDepth._0_7_ = 0;
              nonMovingEffects._239_4_ = 0;
              nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&nonMovingEffects.breakTargets;
              nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)0x0;
              nonMovingEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
              nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                   = _S_red;
              nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                   0;
              nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent = (_Base_ptr)&nonMovingEffects.delegateTargets;
              nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                   = (_Base_ptr)0x0;
              lVar49 = (long)vStack_370.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vStack_370.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
              nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
              nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
              nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left = nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_parent;
              nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                   = (_Base_ptr)psVar18;
              nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)psVar18;
              nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
              nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                   = nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
              if (0 < lVar49) {
                child = child + 3;
                do {
                  ppCVar47 = &callFinder.infos.
                              super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  context._24_8_ =
                       vStack_370.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar49 + -1];
                  sVar21 = std::
                           _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)&psStack_2f8,(key_type *)&context.dropped);
                  bVar55 = sVar21 != 0;
                  if (!bVar55) {
                    ShallowEffectAnalyzer::ShallowEffectAnalyzer
                              ((ShallowEffectAnalyzer *)ppCVar47,(PassOptions *)child,module,
                               (Expression *)context._24_8_);
                    bVar55 = EffectAnalyzer::invalidates
                                       ((EffectAnalyzer *)ppCVar47,(EffectAnalyzer *)auStack_278);
                    if (((((bVar55) || (currEffects.super_EffectAnalyzer.module._4_1_ != '\0')) ||
                         (currEffects.super_EffectAnalyzer.breakTargets._M_t._M_impl.
                          super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0)) ||
                        (((long)&(currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_right)->_M_color +
                          (long)currEffects.super_EffectAnalyzer.localsWritten._M_t._M_impl.
                                super__Rb_tree_header._M_header._M_right != 0 ||
                         (currEffects.super_EffectAnalyzer.module._5_1_ != '\0')))) ||
                       (((ulong)*(byte *)context._24_8_ < 0x36 &&
                        ((0x3000000000000eU >> ((ulong)*(byte *)context._24_8_ & 0x3f) & 1) != 0))))
                    {
LAB_0098ea78:
                      local_2b8._0_8_ = (Call *)&psStack_2f8;
                      std::
                      _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                                ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)&psStack_2f8,&context.dropped,local_2b8);
                      bVar55 = true;
                    }
                    else {
                      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                                ((AbstractChildIterator<wasm::ChildIterator> *)local_2b8,
                                 (Expression *)context._24_8_);
                      uVar52 = (int)local_2b8._0_8_ +
                               (int)((ulong)((long)local_288 - (long)local_290) >> 3);
                      uVar17 = (ulong)uVar52;
                      bVar55 = uVar52 == 0;
                      if (!bVar55) {
                        uVar39 = (long)&(((SpecificExpression<(wasm::Expression::Id)6> *)
                                         local_2b8._0_8_)->super_Expression)._id +
                                 ((long)local_288 - (long)local_290 >> 3);
                        bVar55 = false;
                        do {
                          uVar39 = uVar39 - 1;
                          if (uVar39 == 0xffffffffffffffff) goto LAB_0098f950;
                          in_R9 = (Module *)(local_2b8 + 8);
                          pMVar44 = (Module *)(local_290 + -4);
                          if ((uVar39 & 0xfffffffc) == 0) {
                            pMVar44 = in_R9;
                          }
                          pcVar38 = ((((&(pMVar44->exports).
                                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)
                                       [uVar39 & 0xffffffff]->_M_t).
                                      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                      .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->
                                    name).super_IString.str._M_str;
                          in_R8.id = CONCAT71((int7)((ulong)pMVar44 >> 8),pcVar38 < (char *)0x7);
                          if (((ulong)pcVar38 & 1) != 0 && pcVar38 >= (char *)0x7) break;
                          uVar17 = uVar17 - 1;
                          bVar55 = uVar17 == 0;
                        } while (!bVar55);
                      }
                      if (local_290 != (pointer)0x0) {
                        operator_delete(local_290,(long)local_280 - (long)local_290);
                      }
                      if (!bVar55) goto LAB_0098ea78;
                      bVar55 = false;
                    }
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)local_358);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)local_350);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)local_348);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)&currEffects.super_EffectAnalyzer.localsWritten._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
                    std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
                    std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&currEffects.super_EffectAnalyzer.features);
                  }
                  if (bVar55) {
                    EffectAnalyzer::visit
                              ((EffectAnalyzer *)auStack_278,(Expression *)context._24_8_);
                    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                              ((AbstractChildIterator<wasm::ChildIterator> *)ppCVar47,
                               (Expression *)context._24_8_);
                    uVar52 = (int)((ulong)((long)currEffects.super_EffectAnalyzer.localsRead._M_t.
                                                 _M_impl.super__Rb_tree_header._M_header._M_parent -
                                          currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                          super__Rb_tree_header._M_header._0_8_) >> 3) +
                             (int)callFinder.infos.
                                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (uVar52 != 0) {
                      iVar45 = -1;
                      uVar17 = 0;
                      do {
                        uVar39 = (long)&(callFinder.infos.
                                         super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->call +
                                 ((long)currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                        super__Rb_tree_header._M_header._M_parent -
                                  currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                  super__Rb_tree_header._M_header._0_8_ >> 3);
                        if (uVar39 <= uVar17) {
LAB_0098f950:
                          __assert_fail("index < children.size()",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/iteration.h"
                                        ,0x4a,
                                        "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                                       );
                        }
                        uVar36 = (int)uVar39 + iVar45;
                        pbVar22 = (bool *)(currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                           super__Rb_tree_header._M_header._0_8_ + -0x20 +
                                          (ulong)uVar36 * 8);
                        if ((uVar36 & 0xfffffffc) == 0) {
                          pbVar22 = &currEffects.super_EffectAnalyzer.ignoreImplicitTraps +
                                    (ulong)uVar36 * 8;
                        }
                        local_90._M_thread = **(undefined8 **)pbVar22;
                        local_2b8._0_8_ = (Call *)&psStack_2f8;
                        std::
                        _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                                  ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&psStack_2f8,&local_90,local_2b8);
                        uVar17 = uVar17 + 1;
                        iVar45 = iVar45 + -1;
                      } while (uVar52 != uVar17);
                    }
                    if (currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                        super__Rb_tree_header._M_header._0_8_ != 0) {
                      operator_delete((void *)currEffects.super_EffectAnalyzer.localsRead._M_t.
                                              _M_impl.super__Rb_tree_header._M_header._0_8_,
                                      (long)currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl
                                            .super__Rb_tree_header._M_header._M_left -
                                      currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                      super__Rb_tree_header._M_header._0_8_);
                    }
                  }
                  bVar55 = 1 < lVar49;
                  lVar49 = lVar49 + -1;
                } while (bVar55);
              }
              pp_Var3 = ((Pass *)&this_01->exports)->_vptr_Pass;
              p_Var4 = pp_Var3[3];
              if (p_Var4 != (_func_int *)0x0) {
                p_Var46 = (_func_int *)0x0;
                do {
                  if (pp_Var3[3] <= p_Var46) {
LAB_0098f9ad:
                    __assert_fail("index < usedElements",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                  ,0xbc,
                                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                 );
                  }
                  pEVar31 = *(Expression **)(pp_Var3[2] + (long)p_Var46 * 8);
                  callFinder.infos.
                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  currEffects.super_EffectAnalyzer.ignoreImplicitTraps = false;
                  currEffects.super_EffectAnalyzer.trapsNeverHappen = false;
                  currEffects.super_EffectAnalyzer._2_6_ = 0;
                  currEffects.super_EffectAnalyzer.module = (Module *)0x0;
                  currEffects.super_EffectAnalyzer.features.features = 0;
                  currEffects.super_EffectAnalyzer.branchesOut = false;
                  currEffects.super_EffectAnalyzer.calls = false;
                  currEffects.super_EffectAnalyzer._22_2_ = 0;
                  callFinder.infos.
                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new(0x18);
                  (callFinder.infos.
                   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->call = (Call *)&psStack_2f8;
                  (callFinder.infos.
                   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->drop = &pEStack_108;
                  callFinder.infos.
                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].call =
                       (Call *)&target.super_IString.str._M_str;
                  currEffects.super_EffectAnalyzer._16_8_ =
                       std::
                       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp:429:24)>
                       ::_M_invoke;
                  currEffects.super_EffectAnalyzer.module =
                       (Module *)
                       std::
                       _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp:429:24)>
                       ::_M_manager;
                  local_2b8._0_8_ =
                       ExpressionManipulator::flexibleCopy
                                 (pEVar31,module,
                                  (CustomCopier *)
                                  &callFinder.infos.
                                   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  emplace_back<wasm::Expression*>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_78,(Expression **)local_2b8);
                  if (currEffects.super_EffectAnalyzer.module != (Module *)0x0) {
                    ppCVar47 = &callFinder.infos.
                                super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    (*(code *)currEffects.super_EffectAnalyzer.module)(ppCVar47,ppCVar47,3);
                  }
                  p_Var46 = p_Var46 + 1;
                } while (p_Var4 != p_Var46);
              }
              context.operands.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_1_ =
                   ((Pass *)&this_01->exports)->runner != (PassRunner *)0x0;
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)local_328);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)local_320);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)local_318);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&nonMovingEffects.features);
              std::
              _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&psStack_2f8);
              if (vStack_370.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(vStack_370.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)vStack_370.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)vStack_370.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_398._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity -
                                (long)local_398._M_dataplus._M_p);
              }
              nonMovingEffects.ignoreImplicitTraps =
                   (bool)(undefined1)target.super_IString.str._M_len;
              nonMovingEffects.trapsNeverHappen = (bool)target.super_IString.str._M_len._1_1_;
              nonMovingEffects._2_6_ = target.super_IString.str._M_len._2_6_;
              auStack_278 = auStack_c8;
              __k = (pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *)auStack_78;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &nonMovingEffects.module,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__k);
              nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color.
              _0_1_ = (char)context.operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              __c = std::__detail::
                    _Hash_code_base<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::__detail::_Select1st,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                    ::_M_hash_code((_Hash_code_base<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::__detail::_Select1st,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                    *)auStack_278,__k);
              p_Var23 = std::
                        _Hashtable<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::_M_find_node((_Hashtable<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                        *)newOperands.
                                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       __c % (local_80->funcContextMap)._M_h._M_bucket_count,
                                       (key_type *)auStack_278,__c);
              if (nonMovingEffects.module != (Module *)0x0) {
                operator_delete(nonMovingEffects.module,
                                CONCAT44(nonMovingEffects.localsRead._M_t._M_impl._4_4_,
                                         nonMovingEffects.localsRead._M_t._M_impl._0_4_) -
                                (long)nonMovingEffects.module);
              }
              if (p_Var23 == (__node_ptr)0x0) {
                if ((char)context.operands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                  if ((_func_int *)
                      ((long)context.operands.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3) !=
                      local_338[3]) {
                    __assert_fail("operands.size() == call->operands.size()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                                  ,0x202,
                                  "bool wasm::(anonymous namespace)::CallContext::isTrivial(Call *, Module &)"
                                 );
                  }
                  pFVar19 = Module::getFunction(module,(IString)*(IString *)(local_338 + 6));
                  SVar57 = HeapType::getSignature(&pFVar19->type);
                  callFinder.infos.
                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)SVar57.params.id;
                  bVar55 = (undefined1  [8])
                           context.operands.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start == auStack_78;
                  if (bVar55) {
LAB_0098efcc:
                    if (bVar55) {
                      nonMovingEffects.ignoreImplicitTraps =
                           (bool)(undefined1)target.super_IString.str._M_len;
                      nonMovingEffects.trapsNeverHappen =
                           (bool)target.super_IString.str._M_len._1_1_;
                      nonMovingEffects._2_6_ = target.super_IString.str._M_len._2_6_;
                      auStack_278 = auStack_c8;
                      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &nonMovingEffects.module,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 auStack_78);
                      nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_color._0_1_ =
                           (char)context.operands.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      pmVar34 = std::
                                unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                                ::operator[]((unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                                              *)newOperands.
                                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             (key_type *)auStack_278);
                      (pmVar34->super_IString).str._M_len = (size_t)auStack_c8;
                      (pmVar34->super_IString).str._M_str = (char *)target.super_IString.str._M_len;
                      if (nonMovingEffects.module != (Module *)0x0) {
                        operator_delete(nonMovingEffects.module,
                                        CONCAT44(nonMovingEffects.localsRead._M_t._M_impl._4_4_,
                                                 nonMovingEffects.localsRead._M_t._M_impl._0_4_) -
                                        (long)nonMovingEffects.module);
                      }
                      goto LAB_0098f85b;
                    }
                  }
                  else {
                    pEVar31 = (Expression *)*(uintptr_t *)auStack_78;
                    if (pEVar31->_id == LocalGetId) {
                      pcVar38 = (char *)0x0;
                      pcVar50 = (char *)0x1;
                      do {
                        nonMovingEffects._0_8_ = pcVar38;
                        auStack_278 = (undefined1  [8])
                                      &callFinder.infos.
                                       super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        pTVar24 = wasm::Type::Iterator::operator*((Iterator *)auStack_278);
                        if ((pEVar31->type).id != pTVar24->id) break;
                        pcVar38 = (char *)((long)context.operands.
                                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                           (long)auStack_78 >> 3);
                        bVar55 = pcVar38 <= pcVar50;
                        if (pcVar38 <= pcVar50) goto LAB_0098efcc;
                        pEVar31 = (Expression *)((pointer)((long)auStack_78 + pcVar50 * 8))->id;
                        pcVar38 = pcVar50;
                        pcVar50 = (char *)(ulong)((int)pcVar50 + 1);
                      } while (pEVar31->_id == LocalGetId);
                    }
                  }
                }
                ppEVar12 = context.operands.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                auVar51 = auStack_78;
                sVar25 = Function::getNumParams((Function *)out);
                if ((long)ppEVar12 - (long)auVar51 >> 3 != sVar25) {
                  __assert_fail("context.operands.size() == func->getNumParams()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                                ,0x301,
                                "std::unique_ptr<Function> wasm::(anonymous namespace)::Monomorphize::makeMonoFunctionWithContext(Function *, const CallContext &, Module &)"
                               );
                }
                NVar58 = Names::getValidFunctionName
                                   (module,(IString)*(IString *)
                                                     &(out->exports).
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
                in_R8.id = NVar58.super_IString.str._M_str;
                local_430 = '\0';
                local_2a0 = '\0';
                in_R9 = (Module *)
                        &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                         super__Rb_tree_header._M_node_count;
                NVar58.super_IString.str._M_str = NVar58.super_IString.str._M_len;
                NVar58.super_IString.str._M_len = (size_t)module;
                wasm::ModuleUtils::copyFunctionWithoutAdd
                          ((Function *)&stack0xffffffffffffffc8,out,NVar58,
                           (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                           in_R8.id,(optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_R9);
                if ((local_2a0 == '\x01') &&
                   (local_2a0 = '\0', (Call *)local_2b8._0_8_ != (Call *)0x0)) {
                  operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
                }
                if ((local_430 == '\x01') &&
                   (local_430 = '\0',
                   currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                   super__Rb_tree_header._M_node_count != 0)) {
                  operator_delete((void *)currEffects.super_EffectAnalyzer.delegateTargets._M_t.
                                          _M_impl.super__Rb_tree_header._M_node_count,
                                  local_438 -
                                  currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count);
                }
                ppEVar12 = context.operands.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                psStack_2f8 = (size_t *)0x0;
                immovable._M_h._M_buckets = (__buckets_ptr)0x0;
                immovable._M_h._M_bucket_count = 0;
                for (auVar51 = auStack_78;
                    ppCVar47 = &callFinder.infos.
                                super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    auVar51 != (undefined1  [8])ppEVar12;
                    auVar51 = (undefined1  [8])((long)auVar51 + 8)) {
                  FindAll<wasm::LocalGet>::FindAll
                            ((FindAll<wasm::LocalGet> *)auStack_278,
                             (Expression *)((pointer)auVar51)->id);
                  uVar35 = nonMovingEffects._0_8_;
                  for (auVar53 = auStack_278; auVar53 != (undefined1  [8])uVar35;
                      auVar53 = (undefined1  [8])((long)auVar53 + 8)) {
                    if (immovable._M_h._M_buckets == (__buckets_ptr)immovable._M_h._M_bucket_count)
                    {
                      std::vector<wasm::Type,std::allocator<wasm::Type>>::
                      _M_realloc_insert<wasm::Type_const&>
                                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&psStack_2f8,
                                 (iterator)immovable._M_h._M_buckets,(Type *)(*(long *)auVar53 + 8))
                      ;
                    }
                    else {
                      *immovable._M_h._M_buckets =
                           (__node_base_ptr)((Type *)(*(long *)auVar53 + 8))->id;
                      immovable._M_h._M_buckets = immovable._M_h._M_buckets + 1;
                    }
                  }
                  if (auStack_278 != (undefined1  [8])0x0) {
                    operator_delete((void *)auStack_278,
                                    (long)nonMovingEffects.module - (long)auStack_278);
                  }
                }
                if ((char)context.operands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                  SVar57 = HeapType::getSignature
                                     ((HeapType *)
                                      &(out->globals).
                                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                  TVar26 = SVar57.results.id;
                }
                else {
                  TVar26.id = 0;
                }
                wasm::Type::Type((Type *)&context.dropped,(Tuple *)&psStack_2f8);
                SVar57.results.id = TVar26.id;
                SVar57.params.id = context._24_8_;
                HeapType::HeapType((HeapType *)auStack_278,SVar57);
                ((HeapType *)((long)local_38._M_head_impl + 0x38))->id = (uintptr_t)auStack_278;
                callFinder.infos.
                super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)&currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                               super__Rb_tree_header._M_header._M_parent;
                currEffects.super_EffectAnalyzer.ignoreImplicitTraps = true;
                currEffects.super_EffectAnalyzer.trapsNeverHappen = false;
                currEffects.super_EffectAnalyzer._2_6_ = 0;
                currEffects.super_EffectAnalyzer.module = (Module *)0x0;
                currEffects.super_EffectAnalyzer.features.features = 0;
                currEffects.super_EffectAnalyzer.branchesOut = false;
                currEffects.super_EffectAnalyzer.calls = false;
                currEffects.super_EffectAnalyzer._22_2_ = 0;
                currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl._0_4_ = 0x3f800000;
                currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_color = _S_red;
                currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
                _M_header._4_4_ = 0;
                currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_parent = (_Base_ptr)0x0;
                SVar57 = HeapType::getSignature((HeapType *)((long)local_38._M_head_impl + 0x38));
                auStack_278 = (undefined1  [8])SVar57.params.id.id;
                child = (Expression *)wasm::Type::size((Type *)auStack_278);
                SVar57 = HeapType::getSignature
                                   ((HeapType *)
                                    &(out->globals).
                                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                target.super_IString.str._M_str = (char *)SVar57.params.id;
                sVar25 = wasm::Type::size((Type *)&target.super_IString.str._M_str);
                child = (Expression *)(ulong)(uint)((int)child - (int)sVar25);
                uVar52 = 0;
                while( true ) {
                  auStack_278._0_4_ = uVar52;
                  sVar25 = Function::getNumLocals((Function *)out);
                  if (sVar25 <= uVar52) break;
                  bVar55 = Function::isParam((Function *)out,auStack_278._0_4_);
                  _Var54._M_head_impl = local_38._M_head_impl;
                  uVar10 = auStack_278._0_4_;
                  if (bVar55) {
                    TVar26 = Function::getLocalType((Function *)out,auStack_278._0_4_);
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = TVar26.id;
                    IVar15 = Builder::addVar((Builder *)_Var54._M_head_impl,(Function *)0x0,
                                             (Name)(auVar6 << 0x40),in_R8);
                    pIVar27 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)ppCVar47,(key_type *)auStack_278);
                  }
                  else {
                    pIVar27 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)ppCVar47,(key_type *)auStack_278);
                    IVar15 = uVar10 + (int)child;
                  }
                  *pIVar27 = IVar15;
                  uVar52 = auStack_278._0_4_ + 1;
                }
                if ((out->memories).
                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                  std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::clear(&((local_38._M_head_impl)->localNames)._M_h);
                  std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::clear((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((long)local_38._M_head_impl + 0xa0));
                  uVar52 = 0;
                  while( true ) {
                    target.super_IString.str._M_str =
                         (char *)CONCAT44(target.super_IString.str._M_str._4_4_,uVar52);
                    sVar25 = Function::getNumLocals((Function *)out);
                    if (sVar25 <= uVar52) break;
                    NVar58 = Function::getLocalNameOrDefault
                                       ((Function *)out,(Index)target.super_IString.str._M_str);
                    if (NVar58.super_IString.str._M_str != (char *)0x0) {
                      pmVar28 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)&callFinder.infos.
                                                 super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             (key_type *)&target.super_IString.str._M_str);
                      local_90._M_thread._0_4_ = *pmVar28;
                      _auStack_278 = (string_view)
                                     Names::getValidLocalName(local_38._M_head_impl,NVar58);
                      pmVar29 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)((long)local_38._M_head_impl + 0x68),
                                             (key_type *)&local_90);
                      (pmVar29->super_IString).str._M_len = (size_t)auStack_278;
                      (pmVar29->super_IString).str._M_str = (char *)nonMovingEffects._0_8_;
                      mVar11 = (mapped_type)local_90._M_thread;
                      pmVar30 = std::__detail::
                                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)((long)local_38._M_head_impl + 0xa0),
                                             (key_type *)auStack_278);
                      *pmVar30 = mVar11;
                    }
                    uVar52 = (Index)target.super_IString.str._M_str + 1;
                  }
                }
                target.super_IString.str._M_str = (char *)0x0;
                local_94 = 0;
                local_90._M_thread = (native_handle_type)module;
                if ((undefined1  [8])
                    context.operands.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != auStack_78) {
                  uVar17 = 0;
                  do {
                    pEVar31 = (Expression *)((pointer)((long)auStack_78 + uVar17 * 8))->id;
                    pmVar28 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&callFinder.infos.
                                       super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_94)
                    ;
                    IVar15 = *pmVar28;
                    _auStack_278 = (string_view)ZEXT816(0);
                    nonMovingEffects._16_8_ =
                         std::
                         _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                         ::_M_invoke;
                    nonMovingEffects.module =
                         (Module *)
                         std::
                         _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                         ::_M_manager;
                    pEVar31 = ExpressionManipulator::flexibleCopy
                                        (pEVar31,module,(CustomCopier *)auStack_278);
                    if (nonMovingEffects.module != (Module *)0x0) {
                      (*(code *)nonMovingEffects.module)
                                ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)
                                 auStack_278,
                                 (Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)
                                 auStack_278,3);
                    }
                    pLVar32 = Builder::makeLocalSet((Builder *)&local_90,IVar15,pEVar31);
                    auStack_278 = (undefined1  [8])pLVar32;
                    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                    emplace_back<wasm::Expression*>
                              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                               &target.super_IString.str._M_str,(Expression **)auStack_278);
                    local_94 = local_94 + 1;
                    uVar17 = (ulong)local_94;
                  } while (uVar17 < (ulong)((long)context.operands.
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                            (long)auStack_78 >> 3));
                }
                _auStack_278 = (string_view)ZEXT816(0);
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent = (_Base_ptr)0x0;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     = (_Base_ptr)0x0;
                nonMovingEffects.globalsWritten._M_t._M_impl._4_4_ = 0;
                nonMovingEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_color = _S_red;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                     0;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right = (_Base_ptr)0x0;
                ppCVar47 = &callFinder.infos.
                            super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)ppCVar47;
                Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::pushTask
                          ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)auStack_278,
                           PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::scan,
                           &(local_38._M_head_impl)->body);
                while ((nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header
                        ._0_8_ - CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                                          nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) >> 4)
                       + nonMovingEffects._0_8_ != 0) {
                  if (CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                               nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) ==
                      nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                      _0_8_) {
                    if (nonMovingEffects._0_8_ == 0) {
                      pcVar38 = 
                      "T &wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                      ;
                      goto LAB_0098f9a3;
                    }
                    puVar43 = (undefined8 *)(auStack_278 + nonMovingEffects._0_8_ * 0x10);
                  }
                  else {
                    puVar43 = (undefined8 *)
                              (nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header.
                               _M_header._0_8_ + -0x10);
                  }
                  if (CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                               nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) ==
                      nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                      _0_8_) {
                    if (nonMovingEffects._0_8_ == 0) {
                      pcVar38 = 
                      "void wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::pop_back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                      ;
                      goto LAB_0098f984;
                    }
                    nonMovingEffects._0_8_ = nonMovingEffects._0_8_ + -1;
                  }
                  else {
                    nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ = nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header.
                            _M_header._0_8_ + -0x10;
                  }
                  auStack_278 = (undefined1  [8])puVar43[1];
                  if (*(long *)puVar43[1] == 0) {
                    pcVar38 = 
                    "void wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::walk(Expression *&) [SubType = LocalUpdater, VisitorType = wasm::Visitor<LocalUpdater>]"
                    ;
                    goto LAB_0098f946;
                  }
                  (*(code *)*puVar43)((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)
                                      auStack_278);
                }
                if (target.super_IString.str._M_str != (char *)0x0) {
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  _M_realloc_insert<wasm::Expression*const&>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             &target.super_IString.str._M_str,(iterator)0x0,
                             &(local_38._M_head_impl)->body);
                  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_payload =
                       (_Storage<wasm::Type,_true>)extraout_RDX;
                  BVar33.wasm = (Module *)
                                Builder::
                                makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                          ((Builder *)&local_90,
                                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            *)&target.super_IString.str._M_str,type);
                  *(Module **)((long)local_38._M_head_impl + 0x60) = BVar33.wasm;
                }
                if ((char)context.operands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
                  ReturnUtils::removeReturns(local_38._M_head_impl,module);
                }
                pvVar7 = (void *)CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                                          nonMovingEffects.globalsWritten._M_t._M_impl._0_4_);
                if (pvVar7 != (void *)0x0) {
                  operator_delete(pvVar7,(long)nonMovingEffects.globalsWritten._M_t._M_impl.
                                               super__Rb_tree_header._M_header._M_parent -
                                         (long)pvVar7);
                }
                if (target.super_IString.str._M_str != (char *)0x0) {
                  operator_delete(target.super_IString.str._M_str,
                                  -(long)target.super_IString.str._M_str);
                }
                std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)ppCVar47);
                if (psStack_2f8 != (size_t *)0x0) {
                  operator_delete(psStack_2f8,immovable._M_h._M_bucket_count - (long)psStack_2f8);
                }
                sVar25 = Function::getNumParams(local_38._M_head_impl);
                if (sVar25 < 0x14) {
                  bVar55 = true;
                  if (local_80->onlyWhenHelpful == true) {
                    doOpts(local_80,(Function *)out);
                    uVar52 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                                       ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)auStack_278,
                                        (Expression *)
                                        (out->elementSegments).
                                        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    ppEVar12 = context.operands.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    dVar56 = (double)uVar52;
                    for (auVar51 = auStack_78; auVar51 != (undefined1  [8])ppEVar12;
                        auVar51 = (undefined1  [8])((long)auVar51 + 8)) {
                      uVar52 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                                         ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)auStack_278,
                                          (Expression *)((pointer)auVar51)->id);
                      dVar56 = dVar56 + (double)uVar52;
                    }
                    if ((dVar56 != 0.0) || (NAN(dVar56))) {
                      doOpts(local_80,local_38._M_head_impl);
                      uVar52 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                                         ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)auStack_278,
                                          *(Expression **)((long)local_38._M_head_impl + 0x60));
                      bVar55 = (double)wasm::(anonymous_namespace)::MinPercentBenefit <
                               100.0 - ((double)uVar52 * 100.0) / dVar56;
                    }
                    else {
                      bVar55 = false;
                    }
                  }
                  _Var54._M_head_impl = (Function *)auStack_c8;
                  if (bVar55) {
                    _Var54._M_head_impl = local_38._M_head_impl;
                  }
                  nonMovingEffects.ignoreImplicitTraps =
                       (bool)(undefined1)target.super_IString.str._M_len;
                  nonMovingEffects.trapsNeverHappen = (bool)target.super_IString.str._M_len._1_1_;
                  nonMovingEffects._2_6_ = target.super_IString.str._M_len._2_6_;
                  auStack_278 = auStack_c8;
                  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &nonMovingEffects.module,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_78);
                  nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color.
                  _0_1_ = (char)context.operands.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pmVar34 = std::
                            unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                            ::operator[]((unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                                          *)newOperands.
                                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (key_type *)auStack_278);
                  pcVar38 = ((_Var54._M_head_impl)->super_Importable).super_Named.name.super_IString
                            .str._M_str;
                  (pmVar34->super_IString).str._M_len =
                       ((_Var54._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                       _M_len;
                  (pmVar34->super_IString).str._M_str = pcVar38;
                  if (nonMovingEffects.module != (Module *)0x0) {
                    operator_delete(nonMovingEffects.module,
                                    CONCAT44(nonMovingEffects.localsRead._M_t._M_impl._4_4_,
                                             nonMovingEffects.localsRead._M_t._M_impl._0_4_) -
                                    (long)nonMovingEffects.module);
                  }
                  if (bVar55) {
                    newTarget_00.super_IString.str._M_str = (char *)&pEStack_108;
                    newTarget_00.super_IString.str._M_len =
                         (size_t)*(char **)((long)local_38._M_head_impl + 8);
                    updateCall((Monomorphize *)this_01,*(CallInfo **)local_38._M_head_impl,
                               newTarget_00,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               in_R8.id,in_R9);
                    Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                *)&stack0xffffffffffffffc8);
                  }
                }
                if (local_38._M_head_impl != (Function *)0x0) {
                  std::default_delete<wasm::Function>::operator()
                            ((default_delete<wasm::Function> *)&stack0xffffffffffffffc8,
                             local_38._M_head_impl);
                }
              }
              else {
                sVar25 = *(size_t *)
                          ((long)&(p_Var23->
                                  super__Hash_node_value<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>
                                  ._M_storage._M_storage + 0x38);
                if (sVar25 != target.super_IString.str._M_len) {
                  newTarget.super_IString.str._M_str = (char *)&pEStack_108;
                  newTarget.super_IString.str._M_len = sVar25;
                  updateCall((Monomorphize *)this_01,
                             *(CallInfo **)
                              ((long)&(p_Var23->
                                      super__Hash_node_value<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>
                                      ._M_storage._M_storage + 0x30),newTarget,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             in_R8.id,in_R9);
                }
              }
LAB_0098f85b:
              if (pEStack_108 != (Expression *)0x0) {
                operator_delete(pEStack_108,
                                (long)newOperands.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEStack_108
                               );
              }
              pCVar40 = (pointer)nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                 ._M_node_count;
              if (auStack_78 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_78,
                                (long)context.operands.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78)
                ;
                pCVar40 = (pointer)nonMovingEffects.delegateTargets._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count;
              }
            }
          }
          this_01 = (Module *)&((Pass *)&this_01->exports)->name;
        } while (this_01 != (Module *)pCVar40);
      }
      if (callFinder.
          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .currModule != (Module *)0x0) {
        operator_delete(callFinder.
                        super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                        .currModule,
                        (long)callFinder.infos.
                              super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)callFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .currModule);
      }
      if (callFinder.
          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
          .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
        operator_delete(callFinder.
                        super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                        .stack.fixed._M_elems[9].currp,
                        (long)callFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)callFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .stack.fixed._M_elems[9].currp);
      }
      pNVar37 = local_310 + 1;
    } while (pNVar37 != local_308);
  }
  if (pNStack_e8 != (pointer)0x0) {
    operator_delete(pNStack_e8,
                    (long)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pNStack_e8);
  }
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_6d0);
  return;
}

Assistant:

void run(Module* module) override {
    // TODO: parallelize, see comments below

    applyArguments();

    // Find all the return-calling functions. We cannot remove their returns
    // (because turning a return call into a normal call may break the program
    // by using more stack).
    auto returnCallersMap = ReturnUtils::findReturnCallers(*module);

    // Note the list of all functions. We'll be adding more, and do not want to
    // operate on those.
    std::vector<Name> funcNames;
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { funcNames.push_back(func->name); });

    // Find the calls in each function and optimize where we can, changing them
    // to call the monomorphized targets.
    for (auto name : funcNames) {
      auto* func = module->getFunction(name);

      CallFinder callFinder;
      callFinder.walk(func->body);
      for (auto& info : callFinder.infos) {
        if (info.call->type == Type::unreachable) {
          // Ignore unreachable code.
          // TODO: return_call?
          continue;
        }

        if (info.call->target == name) {
          // Avoid recursion, which adds some complexity (as we'd be modifying
          // ourselves if we apply optimizations).
          continue;
        }

        // If the target function does a return call, then as noted earlier we
        // cannot remove its returns, so do not consider the drop as part of the
        // context in such cases (as if we reverse-inlined the drop into the
        // target then we'd be removing the returns).
        if (returnCallersMap[module->getFunction(info.call->target)]) {
          info.drop = nullptr;
        }

        processCall(info, *module);
      }
    }
  }